

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O0

bool rr::LineRasterUtil::lineInCornerOutsideAngleRange
               (SubpixelLineSegment *line,Vector<long,_2> *cornerExitNormal)

{
  long lVar1;
  long lVar2;
  long lVar3;
  deInt64 dotProduct;
  Vector<long,_2> v;
  Vector<long,_2> *cornerExitNormal_local;
  SubpixelLineSegment *line_local;
  
  v.m_data[1] = (long)cornerExitNormal;
  SubpixelLineSegment::direction((SubpixelLineSegment *)&dotProduct);
  lVar1 = tcu::dot<long,2>((Vector<long,_2> *)&dotProduct,(Vector<long,_2> *)v.m_data[1]);
  if (lVar1 < 0) {
    lVar2 = tcu::lengthSquared<long,2>((Vector<long,_2> *)&dotProduct);
    lVar3 = tcu::lengthSquared<long,2>((Vector<long,_2> *)v.m_data[1]);
    line_local._7_1_ = lVar1 * -2 * -lVar1 < lVar2 * lVar3;
  }
  else {
    line_local._7_1_ = true;
  }
  return line_local._7_1_;
}

Assistant:

bool lineInCornerOutsideAngleRange (const SubpixelLineSegment& line, const tcu::Vector<deInt64,2>& cornerExitNormal)
{
	// v0 -> v1 has angle difference to cornerExitNormal in range (-135, 135)
	const tcu::Vector<deInt64,2> v = line.direction();
	const deInt64 dotProduct = dot(v, cornerExitNormal);

	// dotProduct > -|v1-v0|*|cornerExitNormal|/sqrt(2)
	if (dotProduct >= 0)
		return true;
	return 2 * (-dotProduct) * (-dotProduct) < tcu::lengthSquared(v)*tcu::lengthSquared(cornerExitNormal);
}